

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

Optional<unsigned_int> Catch::parseUInt(string *input,int base)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  undefined8 extraout_RDX;
  Optional<unsigned_int> *in_RDI;
  Optional<unsigned_int> OVar6;
  invalid_argument *anon_var_0;
  out_of_range *anon_var_0_1;
  unsigned_long_long ret;
  size_t pos;
  string trimmed;
  size_t *in_stack_ffffffffffffff58;
  unsigned_long_long uVar7;
  string *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff78;
  uint local_5c;
  unsigned_long_long local_58;
  long local_50;
  undefined4 local_48;
  string local_38 [56];
  
  trim(in_stack_ffffffffffffff78);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    if (*pcVar4 != '-') {
      local_50 = 0;
      local_58 = std::__cxx11::stoull(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0);
      lVar1 = local_50;
      lVar5 = std::__cxx11::string::size();
      if (lVar1 == lVar5) {
        uVar7 = local_58;
        uVar2 = std::numeric_limits<unsigned_int>::max();
        if (uVar2 < uVar7) {
          Optional<unsigned_int>::Optional(in_RDI);
        }
        else {
          local_5c = (uint)local_58;
          Optional<unsigned_int>::Optional(in_RDI,&local_5c);
        }
      }
      else {
        Optional<unsigned_int>::Optional(in_RDI);
      }
      goto LAB_0018ce7f;
    }
  }
  Optional<unsigned_int>::Optional(in_RDI);
LAB_0018ce7f:
  local_48 = 1;
  std::__cxx11::string::~string(local_38);
  OVar6.storage[0] = (char)extraout_RDX;
  OVar6.storage[1] = (char)((ulong)extraout_RDX >> 8);
  OVar6.storage[2] = (char)((ulong)extraout_RDX >> 0x10);
  OVar6.storage[3] = (char)((ulong)extraout_RDX >> 0x18);
  OVar6._12_4_ = (int)((ulong)extraout_RDX >> 0x20);
  OVar6.nullableValue = (uint *)in_RDI;
  return OVar6;
}

Assistant:

Optional<unsigned int> parseUInt(std::string const& input, int base) {
        auto trimmed = trim( input );
        // std::stoull is annoying and accepts numbers starting with '-',
        // it just negates them into unsigned int
        if ( trimmed.empty() || trimmed[0] == '-' ) {
            return {};
        }

        CATCH_TRY {
            size_t pos = 0;
            const auto ret = std::stoull( trimmed, &pos, base );

            // We did not consume the whole input, so there is an issue
            // This can be bunch of different stuff, like multiple numbers
            // in the input, or invalid digits/characters and so on. Either
            // way, we do not want to return the partially parsed result.
            if ( pos != trimmed.size() ) {
                return {};
            }
            // Too large
            if ( ret > std::numeric_limits<unsigned int>::max() ) {
                return {};
            }
            return static_cast<unsigned int>(ret);
        }